

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Implementation.hpp
# Opt level: O1

ssize_t __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::write
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,int __fd,
          void *__buf,size_t __n)

{
  uint8_t *puVar1;
  int *piVar2;
  uint uVar3;
  uint *puVar4;
  uint *extraout_RAX;
  ssize_t extraout_RAX_00;
  uint *extraout_RAX_01;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  Port port;
  CIAAHandler *this_00;
  
  uVar9 = (ulong)__buf & 0xffffffff;
  puVar4 = &switchD_0020cc59::switchdataD_004ae404;
  bVar7 = (byte)uVar9;
  uVar3 = (uint)__buf;
  switch(__fd & 0xf) {
  case 0:
    (this->super_MOS6526Storage).output_[0] = bVar7;
    bVar7 = ~(this->super_MOS6526Storage).data_direction_[0] | bVar7;
    this_00 = this->port_handler_;
    goto LAB_0020ccc0;
  case 1:
    (this->super_MOS6526Storage).output_[1] = bVar7;
    bVar7 = ~(this->super_MOS6526Storage).data_direction_[1] | bVar7;
    this_00 = this->port_handler_;
    goto LAB_0020cd31;
  case 2:
    (this->super_MOS6526Storage).data_direction_[0] = bVar7;
    bVar7 = ~bVar7 | (this->super_MOS6526Storage).output_[0];
    this_00 = this->port_handler_;
LAB_0020ccc0:
    port = A;
LAB_0020cd36:
    Amiga::Chipset::CIAAHandler::set_port_output(this_00,port,bVar7);
    return extraout_RAX_00;
  case 3:
    (this->super_MOS6526Storage).data_direction_[1] = bVar7;
    bVar7 = ~bVar7 | (this->super_MOS6526Storage).output_[1];
    this_00 = this->port_handler_;
LAB_0020cd31:
    port = B;
    goto LAB_0020cd36;
  case 4:
    uVar3 = uVar3 & 0xff |
            (uint)*(byte *)((long)&(this->super_MOS6526Storage).counter_[0].reload + 1) << 8;
    puVar4 = (uint *)(ulong)uVar3;
    (this->super_MOS6526Storage).counter_[0].reload = (uint16_t)uVar3;
    if (((this->super_MOS6526Storage).counter_[0].pending & 2) == 0) {
      return (ssize_t)puVar4;
    }
    goto LAB_0020cdc0;
  case 5:
    uVar3 = (uVar3 & 0xff) << 8 | (uint)(byte)(this->super_MOS6526Storage).counter_[0].reload;
    puVar4 = (uint *)(ulong)uVar3;
    (this->super_MOS6526Storage).counter_[0].reload = (uint16_t)uVar3;
    puVar1 = &(this->super_MOS6526Storage).counter_[0].control;
    *puVar1 = *puVar1 | 1;
    uVar3 = (this->super_MOS6526Storage).counter_[0].pending;
    (this->super_MOS6526Storage).counter_[0].pending = uVar3 | 1;
    if ((uVar3 & 2) == 0) {
      return (ssize_t)puVar4;
    }
LAB_0020cdc0:
    (this->super_MOS6526Storage).counter_[0].value = (uint16_t)puVar4;
    break;
  case 6:
    uVar3 = uVar3 & 0xff |
            (uint)*(byte *)((long)&(this->super_MOS6526Storage).counter_[1].reload + 1) << 8;
    puVar4 = (uint *)(ulong)uVar3;
    (this->super_MOS6526Storage).counter_[1].reload = (uint16_t)uVar3;
    if (((this->super_MOS6526Storage).counter_[1].pending & 2) == 0) {
      return (ssize_t)puVar4;
    }
    goto LAB_0020ce1a;
  case 7:
    uVar3 = (uVar3 & 0xff) << 8 | (uint)(byte)(this->super_MOS6526Storage).counter_[1].reload;
    puVar4 = (uint *)(ulong)uVar3;
    (this->super_MOS6526Storage).counter_[1].reload = (uint16_t)uVar3;
    puVar1 = &(this->super_MOS6526Storage).counter_[1].control;
    *puVar1 = *puVar1 | 1;
    uVar3 = (this->super_MOS6526Storage).counter_[1].pending;
    (this->super_MOS6526Storage).counter_[1].pending = uVar3 | 1;
    if ((uVar3 & 2) == 0) {
      return (ssize_t)puVar4;
    }
LAB_0020ce1a:
    (this->super_MOS6526Storage).counter_[1].value = (uint16_t)puVar4;
    break;
  case 8:
    if ((this->tod_).super_TODBase.write_alarm == true) {
      *(byte *)&(this->tod_).alarm_ = bVar7;
    }
    else {
      *(byte *)&(this->tod_).value_ = bVar7;
      (this->tod_).increment_mask_ = 0xffffffff;
    }
    break;
  case 9:
    puVar4 = (uint *)(ulong)((uVar3 & 0xff) << 8);
    if ((this->tod_).super_TODBase.write_alarm != true) {
      uVar3 = 0xffff00ff;
LAB_0020ce69:
      (this->tod_).value_ = uVar3 & (this->tod_).value_ | (uint)puVar4;
      (this->tod_).increment_mask_ = 0;
      return (ssize_t)puVar4;
    }
    uVar3 = 0xffff00ff;
    goto LAB_0020cde2;
  case 10:
    puVar4 = (uint *)(ulong)((uVar3 & 0xff) << 0x10);
    if ((this->tod_).super_TODBase.write_alarm != true) {
      uVar3 = 0xff00ffff;
      goto LAB_0020ce69;
    }
    uVar3 = 0xff00ffff;
LAB_0020cde2:
    (this->tod_).alarm_ = uVar3 & (this->tod_).alarm_ | (uint)puVar4;
    break;
  case 0xc:
    MOS6526<Amiga::Chipset::CIAAHandler,(MOS::MOS6526::Personality)1>::write();
    puVar4 = extraout_RAX_01;
    break;
  case 0xd:
    bVar5 = (this->super_MOS6526Storage).interrupt_control_;
    bVar6 = bVar7 & 0x7f | bVar5;
    puVar4 = (uint *)(ulong)bVar6;
    bVar5 = ~bVar7 & bVar5;
    if ((char)bVar7 < '\0') {
      bVar5 = bVar6;
    }
    (this->super_MOS6526Storage).interrupt_control_ = bVar5;
    if (((this->super_MOS6526Storage).interrupt_state_ & bVar5) != 0) {
      piVar2 = &(this->super_MOS6526Storage).pending_;
      *(byte *)piVar2 = (byte)*piVar2 | 1;
    }
    break;
  case 0xe:
    MOS6526Storage::Counter::set_control<false>((this->super_MOS6526Storage).counter_,bVar7);
    puVar4 = (uint *)CONCAT71((int7)(uVar9 >> 8),bVar7 >> 7);
    (this->tod_).super_TODBase.is_50Hz = (bool)(bVar7 >> 7);
    bVar8 = (bool)(bVar7 >> 6 & 1);
    if ((this->super_MOS6526Storage).shifter_is_output_ != bVar8) {
      (this->super_MOS6526Storage).shifter_is_output_ = bVar8;
      (this->super_MOS6526Storage).shift_bits_ = 0;
    }
    break;
  case 0xf:
    MOS6526Storage::Counter::set_control<true>
              ((this->super_MOS6526Storage).counter_ + 1,(uint8_t)__buf);
    (this->tod_).super_TODBase.write_alarm = (bool)((byte)(uVar9 >> 7) & 1);
    puVar4 = extraout_RAX;
  }
  return (ssize_t)puVar4;
}

Assistant:

void MOS6526<BusHandlerT, personality>::write(int address, uint8_t value) {
	address &= 0xf;
	switch(address) {
		// Port output.
		case 0:
			output_[0] = value;
			set_port_output<0>();
		break;
		case 1:
			output_[1] = value;
			set_port_output<1>();
		break;

		// Port direction.
		case 2:
			data_direction_[0] = value;
			set_port_output<0>();
		break;
		case 3:
			data_direction_[1] = value;
			set_port_output<1>();
		break;

		// Counters; writes set the reload values.
		case 4:		counter_[0].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 5:		counter_[0].template set_reload<8, personality == Personality::P8250>(value);	break;
		case 6:		counter_[1].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 7:		counter_[1].template set_reload<8, personality == Personality::P8250>(value);	break;

		// Time-of-day clock.
		case 8:		tod_.template write<0>(value);	break;
		case 9:		tod_.template write<1>(value);	break;
		case 10:	tod_.template write<2>(value);	break;
		case 11:	tod_.template write<3>(value);	break;

		// Interrupt control.
		case 13: {
			if(value & 0x80) {
				interrupt_control_ |= value & 0x7f;
			} else {
				interrupt_control_ &= ~(value & 0x7f);
			}
			update_interrupts();
		} break;

		// Control. Posted to both the counters and the clock as it affects both.
		case 14:
			counter_[0].template set_control<false>(value);
			tod_.template set_control<false>(value);
			if(shifter_is_output_ != bool(value & 0x40)) {
				shifter_is_output_ = value & 0x40;
				shift_bits_ = 0;
			}
		break;
		case 15:
			counter_[1].template set_control<true>(value);
			tod_.template set_control<true>(value);
		break;

		// Shift control.
		case 12:
			log.error().append("TODO: write to shift register");
		break;

		// Logically unreachable.
		default: break;
	}
}